

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_io.c
# Opt level: O0

cram_fd * cram_open(char *filename,char *mode)

{
  size_t sVar1;
  hFILE *fp_00;
  char local_33 [3];
  cram_fd *pcStack_30;
  char fmode [3];
  cram_fd *fd;
  hFILE *fp;
  char *mode_local;
  char *filename_local;
  
  local_33[0] = *mode;
  local_33[1] = 0;
  local_33[2] = 0;
  sVar1 = strlen(mode);
  if ((1 < sVar1) && ((mode[1] == 'b' || (mode[1] == 'c')))) {
    local_33[1] = 0x62;
  }
  fp_00 = hopen(filename,local_33);
  if (fp_00 == (hFILE *)0x0) {
    filename_local = (char *)0x0;
  }
  else {
    pcStack_30 = cram_dopen(fp_00,filename,mode);
    if (pcStack_30 == (cram_fd *)0x0) {
      hclose_abruptly(fp_00);
    }
    filename_local = (char *)pcStack_30;
  }
  return (cram_fd *)filename_local;
}

Assistant:

cram_fd *cram_open(const char *filename, const char *mode) {
    hFILE *fp;
    cram_fd *fd;
    char fmode[3]= { mode[0], '\0', '\0' };

    if (strlen(mode) > 1 && (mode[1] == 'b' || mode[1] == 'c')) {
	fmode[1] = 'b';
    }

    fp = hopen(filename, fmode);
    if (!fp)
	return NULL;

    fd = cram_dopen(fp, filename, mode);
    if (!fd)
	hclose_abruptly(fp);

    return fd;
}